

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitFactor.c
# Opt level: O1

Kit_Edge_t Kit_SopFactorTrivialCube_rec(Kit_Graph_t *pFForm,uint uCube,int nStart,int nFinish)

{
  int iVar1;
  int iVar2;
  Kit_Edge_t KVar3;
  Kit_Edge_t eEdge1;
  uint uVar4;
  uint uVar5;
  
  if (uCube == 0) {
    __assert_fail("uCube",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitFactor.c"
                  ,0xcb,
                  "Kit_Edge_t Kit_SopFactorTrivialCube_rec(Kit_Graph_t *, unsigned int, int, int)");
  }
  if (nStart < nFinish) {
    iVar1 = 0;
    uVar4 = 0xffffffff;
    uVar5 = nStart;
    do {
      iVar1 = iVar1 + (uint)((uCube >> (uVar5 & 0x1f) & 1) != 0);
      if ((uCube >> (uVar5 & 0x1f) & 1) != 0) {
        uVar4 = uVar5;
      }
      uVar5 = uVar5 + 1;
    } while (nFinish != uVar5);
  }
  else {
    uVar4 = 0xffffffff;
    iVar1 = 0;
  }
  if (uVar4 == 0xffffffff) {
    __assert_fail("iLit != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitFactor.c"
                  ,0xd4,
                  "Kit_Edge_t Kit_SopFactorTrivialCube_rec(Kit_Graph_t *, unsigned int, int, int)");
  }
  if (iVar1 == 1) {
    return (Kit_Edge_t)(uVar4 - ((int)uVar4 >> 0x1f) & 0x7ffffffe | uVar4 & 1);
  }
  uVar4 = nStart;
  if (nStart < nFinish) {
    iVar2 = 0;
    uVar5 = nStart;
    do {
      uVar4 = uVar5;
      if ((uCube >> (uVar4 & 0x1f) & 1) != 0) {
        if (iVar2 == iVar1 / 2) break;
        iVar2 = iVar2 + 1;
      }
      uVar5 = uVar4 + 1;
      uVar4 = nFinish;
    } while (nFinish != uVar5);
  }
  KVar3 = Kit_SopFactorTrivialCube_rec(pFForm,uCube,nStart,uVar4);
  eEdge1 = Kit_SopFactorTrivialCube_rec(pFForm,uCube,uVar4,nFinish);
  KVar3 = Kit_GraphAddNodeAnd(pFForm,KVar3,eEdge1);
  return KVar3;
}

Assistant:

Kit_Edge_t Kit_SopFactorTrivialCube_rec( Kit_Graph_t * pFForm, unsigned uCube, int nStart, int nFinish )
{
    Kit_Edge_t eNode1, eNode2;
    int i, iLit = -1, nLits, nLits1, nLits2;
    assert( uCube );
    // count the number of literals in this interval
    nLits = 0;
    for ( i = nStart; i < nFinish; i++ )
        if ( Kit_CubeHasLit(uCube, i) )
        {
            iLit = i;
            nLits++;
        }
    assert( iLit != -1 );
    // quit if there is only one literal        
    if ( nLits == 1 )
        return Kit_EdgeCreate( iLit/2, iLit%2 ); // CST
    // split the literals into two parts
    nLits1 = nLits/2;
    nLits2 = nLits - nLits1;
//    nLits2 = nLits/2;
//    nLits1 = nLits - nLits2;
    // find the splitting point
    nLits = 0;
    for ( i = nStart; i < nFinish; i++ )
        if ( Kit_CubeHasLit(uCube, i) )
        {
            if ( nLits == nLits1 )
                break;
            nLits++;
        }
    // recursively construct the tree for the parts
    eNode1 = Kit_SopFactorTrivialCube_rec( pFForm, uCube, nStart, i  );
    eNode2 = Kit_SopFactorTrivialCube_rec( pFForm, uCube, i, nFinish );
    return Kit_GraphAddNodeAnd( pFForm, eNode1, eNode2 );
}